

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

Reference __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeVariable
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,int var_index)

{
  TestProblemBuilder *in_RDI;
  Argument1 in_stack_ffffffffffffff98;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int local_14 [4];
  BasicTestExpr<0> local_4;
  
  internal::Unused<int>(local_14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  TestProblemBuilder::ReportUnhandledConstruct(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
  return (Reference)local_4.id_;
}

Assistant:

Reference MakeVariable(int var_index) {
    internal::Unused(var_index);
    MP_DISPATCH(ReportUnhandledConstruct("variable in nonlinear expression"));
    return Reference();
  }